

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

void __thiscall flexbuffers::Builder::Null(Builder *this)

{
  pointer *ppVVar1;
  iterator __position;
  anon_union_8_3_83789bcb_for_Value_0 local_18;
  undefined8 uStack_10;
  
  local_18.i_ = 0;
  uStack_10 = 0;
  __position._M_current =
       (this->stack_).
       super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stack_).
      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
    _M_realloc_insert<flexbuffers::Builder::Value>(&this->stack_,__position,(Value *)&local_18);
  }
  else {
    ((__position._M_current)->field_0).i_ = 0;
    (__position._M_current)->type_ = FBT_NULL;
    (__position._M_current)->min_bit_width_ = BIT_WIDTH_8;
    ppVVar1 = &(this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return;
}

Assistant:

void Null() { stack_.push_back(Value()); }